

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

string * __thiscall
r_comp::Decompiler::get_variable_name_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,uint16_t index,bool postfix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  uint16_t index_local;
  string s;
  char buffer [255];
  
  paVar1 = &s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  index_local = index;
  s._M_dataplus._M_p = (pointer)paVar1;
  iVar2 = std::
          _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->variable_names)._M_h,&index_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::assign((char *)&s);
    this->last_variable_id = this->last_variable_id + 1;
    sprintf(buffer,"%d");
    std::__cxx11::string::append((char *)&s);
    pmVar3 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->variable_names,&index_local);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    if (postfix) {
      std::__cxx11::string::push_back((char)&s);
    }
    OutStream::insert<std::__cxx11::string>(this->out_stream,(ulong)index_local,&s);
    if (postfix) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&s);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = s._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = s._M_string_length;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      s._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 0x10));
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string Decompiler::get_variable_name(uint16_t index, bool postfix)
{
    std::string s;
    std::unordered_map<uint16_t, std::string>::iterator it = variable_names.find(index);

    if (it == variable_names.end()) {
        char buffer[255];
        s = "v";
        sprintf(buffer, "%d", last_variable_id++);
        s += buffer;
        variable_names[index] = s;

        if (postfix) {
            s += ':';
        }

        out_stream->insert(index, s);

        if (postfix) {
            return s.substr(0, s.length() - 1);
        }

        return s;
    }

    return it->second;
}